

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O2

GLvoid __thiscall glcts::anon_unknown_0::GatherBase::CreateTexture2DInt(GatherBase *this)

{
  CallLogWrapper *this_00;
  int internalformat;
  long lVar1;
  uint type;
  int i;
  int level;
  uint width;
  allocator_type local_89;
  Vector<int,_4> local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> pixels;
  
  internalformat = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])()
  ;
  (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x17])
            ((string *)&local_88,this);
  lVar1 = std::__cxx11::string::find((char)(string *)&local_88,0x75);
  type = lVar1 == -1 ^ 0x1405;
  std::__cxx11::string::~string((string *)&local_88);
  this_00 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(this_00,1,&this->tex);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->tex);
  width = 0x20;
  for (level = 0; level != 6; level = level + 1) {
    glu::CallLogWrapper::glTexImage2D
              (this_00,0xde1,level,internalformat,width,width,0,0x8d99,type,(void *)0x0);
    width = width >> 1;
  }
  tcu::Vector<int,_4>::Vector(&local_88,999);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            (&pixels,0x400,&local_88,&local_89);
  glu::CallLogWrapper::glTexSubImage2D
            (this_00,0xde1,0,0,0,0x20,0x20,0x8d99,type,
             pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  local_88.m_data[0] = 0xc;
  local_88.m_data[1] = 0xd;
  local_88.m_data[2] = 0xe;
  local_88.m_data[3] = 0xf;
  local_78 = 0x900000008;
  uStack_70 = 0xb0000000a;
  local_68 = 0x100000000;
  uStack_60 = 0x300000002;
  local_58 = 0x500000004;
  uStack_50 = 0x700000006;
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,0,0x16,0x19,2,2,0x8d99,type,&local_88);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,0,0x10,10,1,1,0x8d99,type,&local_88);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,0,0xb,2,1,1,0x8d99,type,&local_78);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,0,0x18,0xd,1,1,0x8d99,type,&local_68);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,0,9,0xe,1,1,0x8d99,type,&local_58);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x8072,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
            (&pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>)
  ;
  return;
}

Assistant:

virtual GLvoid CreateTexture2DInt()
	{
		GLenum		internal_format = InternalFormat();
		const GLint csize			= 32;
		GLint		size			= csize;
		GLenum		target			= GL_TEXTURE_2D;
		GLenum		tex_type		= Type().find('u') != std::string::npos ? GL_UNSIGNED_INT : GL_INT;

		glGenTextures(1, &tex);
		glBindTexture(target, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			glTexImage2D(target, i, internal_format, size, size, 0, GL_RGBA_INTEGER, tex_type, 0);
		}
		std::vector<IVec4> pixels(csize * csize, IVec4(999));
		glTexSubImage2D(target, 0, 0, 0, csize, csize, GL_RGBA_INTEGER, tex_type, &pixels[0]);

		IVec4 data[4] = { IVec4(12, 13, 14, 15), IVec4(8, 9, 10, 11), IVec4(0, 1, 2, 3), IVec4(4, 5, 6, 7) };

		glTexSubImage2D(target, 0, 22, 25, 2, 2, GL_RGBA_INTEGER, tex_type, data);
		glTexSubImage2D(target, 0, 16, 10, 1, 1, GL_RGBA_INTEGER, tex_type, data + 0);
		glTexSubImage2D(target, 0, 11, 2, 1, 1, GL_RGBA_INTEGER, tex_type, data + 1);
		glTexSubImage2D(target, 0, 24, 13, 1, 1, GL_RGBA_INTEGER, tex_type, data + 2);
		glTexSubImage2D(target, 0, 9, 14, 1, 1, GL_RGBA_INTEGER, tex_type, data + 3);

		glTexParameteri(target, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(target, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	}